

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

string * __thiscall cmake::StripExtension(string *__return_storage_ptr__,cmake *this,string *file)

{
  bool bVar1;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ext;
  size_type dotpos;
  string *file_local;
  cmake *this_local;
  
  ext.field_2._8_8_ = std::__cxx11::string::rfind((char)file,0x2e);
  if (ext.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)file);
    bVar1 = IsSourceExtension(this,(string *)local_48);
    if ((bVar1) || (bVar1 = IsHeaderExtension(this,(string *)local_48), bVar1)) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)file);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)local_48);
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)file);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::StripExtension(const std::string& file) const
{
  auto dotpos = file.rfind('.');
  if (dotpos != std::string::npos) {
    auto ext = file.substr(dotpos + 1);
#if defined(_WIN32) || defined(__APPLE__)
    ext = cmSystemTools::LowerCase(ext);
#endif
    if (this->IsSourceExtension(ext) || this->IsHeaderExtension(ext)) {
      return file.substr(0, dotpos);
    }
  }
  return file;
}